

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  int *piVar1;
  Allocator *pAVar2;
  FILE *pFVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  reference pvVar7;
  undefined8 uVar8;
  reference pvVar9;
  Mat *pMVar10;
  ulong uVar11;
  reference pvVar12;
  reference ppLVar13;
  long *in_RSI;
  long *in_RDI;
  int lr;
  int j_4;
  int j_3;
  int dims;
  Blob *blob_2;
  int j_2;
  int *psh;
  Mat shape_hints;
  int pdlr;
  Blob *blob_1;
  int top_blob_index;
  int j_1;
  Blob *blob;
  int bottom_blob_index;
  int j;
  int custom_index;
  Layer *layer;
  int top_count;
  int bottom_count;
  int typeindex;
  int i;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  Mat *in_stack_fffffffffffff930;
  Layer *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff948;
  uint in_stack_fffffffffffff94c;
  int in_stack_fffffffffffff950;
  int in_stack_fffffffffffff954;
  NetPrivate *in_stack_fffffffffffff960;
  Net *in_stack_fffffffffffff9e0;
  int local_540;
  int local_53c;
  void *local_538;
  int *local_530;
  undefined8 local_528;
  undefined4 local_520;
  long *local_518;
  undefined4 local_510;
  int local_50c;
  int local_508;
  undefined4 local_504;
  int local_500;
  ulong local_4f8;
  undefined1 local_4f0 [8];
  int *local_4e8;
  Allocator *local_4e0;
  undefined4 local_4d8;
  long *local_4d0;
  undefined4 local_4c8;
  int local_4c4;
  int local_4c0;
  undefined4 local_4bc;
  int local_4b8;
  long local_4b0;
  NetPrivate *local_4a8;
  int *local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  long *local_488;
  undefined4 local_480;
  int local_47c;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  long local_468;
  int local_45c;
  reference local_458;
  int local_44c;
  int *local_448;
  Mat local_440;
  Mat local_3f8;
  int local_3ac;
  reference local_3a8;
  int local_3a0;
  int local_39c;
  reference local_398;
  int local_38c;
  int local_388;
  uint local_384;
  Layer *local_380;
  undefined4 local_378;
  int local_368;
  int local_364;
  uint local_360;
  uint local_35c;
  ParamDict local_358;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_324;
  Mat *local_320;
  int local_318;
  undefined4 local_314;
  Mat *local_310;
  reference local_308;
  reference local_300;
  int local_2f8;
  undefined4 local_2f4;
  Mat *local_2f0;
  reference local_2e8;
  reference local_2e0;
  void **local_2d0;
  Mat *local_2c8;
  Mat *local_2c0;
  undefined8 *local_2b0;
  Mat *local_2a8;
  Mat *local_2a0;
  NetPrivate **local_290;
  Mat *local_288;
  Mat *local_280;
  Mat *local_278;
  NetPrivate **local_268;
  undefined1 *local_258;
  void **local_248;
  Mat *local_238;
  int local_218;
  undefined4 local_214;
  Mat *local_210;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  int local_1d8;
  undefined4 local_1d4;
  undefined1 *local_1d0;
  int local_1b8;
  undefined4 local_1b4;
  NetPrivate **local_1b0;
  int local_198;
  undefined4 local_194;
  Mat *local_190;
  int local_188;
  undefined4 local_184;
  Mat *local_180;
  int local_178;
  undefined4 local_174;
  Mat *local_170;
  int local_168;
  undefined4 local_164;
  Mat *local_160;
  int local_158;
  undefined4 local_154;
  reference local_150;
  int local_148;
  undefined4 local_144;
  reference local_140;
  Mat *local_138;
  Mat *local_130;
  undefined8 local_128;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 local_110;
  int local_104;
  NetPrivate **local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_d8;
  int local_d4;
  Net *local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  void **local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  NetPrivate *local_58;
  _func_int **local_48;
  void *local_38;
  Mat *local_18;
  undefined4 local_c;
  long local_8;
  
  local_33c = 0;
  local_338 = in_RSI;
  lVar6 = (**(code **)(*in_RSI + 0x18))(in_RSI,&local_33c,4);
  if (lVar6 == 4) {
    if (local_33c == 0x7685dd) {
      local_340 = 0;
      local_344 = 0;
      lVar6 = (**(code **)(*local_338 + 0x18))(local_338,&local_340,4);
      if (lVar6 == 4) {
        lVar6 = (**(code **)(*local_338 + 0x18))(local_338,&local_344,4);
        if (lVar6 == 4) {
          if ((local_340 < 1) || (local_344 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count");
            fprintf(_stderr,"\n");
            local_324 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            ParamDict::ParamDict
                      ((ParamDict *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
            for (local_35c = 0; (int)local_35c < local_340; local_35c = local_35c + 1) {
              lVar6 = (**(code **)(*local_338 + 0x18))(local_338,&local_360,4);
              if (lVar6 != 4) {
                fprintf(_stderr,"read typeindex failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_0019cf54;
              }
              lVar6 = (**(code **)(*local_338 + 0x18))(local_338,&local_364,4);
              if (lVar6 != 4) {
                fprintf(_stderr,"read bottom_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_0019cf54;
              }
              lVar6 = (**(code **)(*local_338 + 0x18))(local_338,&local_368,4);
              if (lVar6 != 4) {
                fprintf(_stderr,"read top_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_0019cf54;
              }
              local_380 = (Layer *)(**(code **)(*in_RDI + 0x30))(in_RDI,local_360);
              if (local_380 == (Layer *)0x0) {
                local_380 = create_layer((int)((ulong)in_stack_fffffffffffff938 >> 0x20));
              }
              if (local_380 == (Layer *)0x0) {
                local_384 = local_360 & 0xfffffeff;
                local_380 = (Layer *)(**(code **)(*in_RDI + 0x28))(in_RDI,local_384);
              }
              if (local_380 == (Layer *)0x0) {
                fprintf(_stderr,"layer %d not exists or registered",(ulong)local_360);
                fprintf(_stderr,"\n");
                clear(in_stack_fffffffffffff9e0);
                local_324 = -1;
                goto LAB_0019cf54;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
              for (local_388 = 0; local_388 < local_364; local_388 = local_388 + 1) {
                lVar6 = (**(code **)(*local_338 + 0x18))(local_338,&local_38c,4);
                if (lVar6 != 4) {
                  fprintf(_stderr,"read bottom_blob_index failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  goto LAB_0019cf54;
                }
                local_398 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_38c);
                iVar4 = local_38c;
                local_398->consumer = local_35c;
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_380->bottoms,(long)local_388);
                *pvVar7 = iVar4;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
              for (local_39c = 0; local_39c < local_368; local_39c = local_39c + 1) {
                lVar6 = (**(code **)(*local_338 + 0x18))(local_338,&local_3a0,4);
                if (lVar6 != 4) {
                  fprintf(_stderr,"read top_blob_index failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  goto LAB_0019cf54;
                }
                local_3a8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_3a0);
                iVar4 = local_3a0;
                local_3a8->producer = local_35c;
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_380->tops,(long)local_39c);
                *pvVar7 = iVar4;
              }
              local_3ac = ParamDict::load_param_bin
                                    ((ParamDict *)
                                     CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                                     (DataReader *)
                                     CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
              uVar5 = local_35c;
              pFVar3 = _stderr;
              if (local_3ac == 0) {
                if ((local_380->support_int8_storage & 1U) != 0) {
                  *(undefined1 *)((long)in_RDI + 0x27) = 0;
                }
                local_320 = &local_440;
                local_440.data = (void *)0x0;
                local_440.refcount = (int *)0x0;
                local_440.elemsize = 0;
                local_440.elempack = 0;
                local_440.allocator = (Allocator *)0x0;
                local_440.dims = 0;
                local_440.w = 0;
                local_440.h = 0;
                local_440.d = 0;
                local_440.c = 0;
                local_440.cstep = 0;
                ParamDict::get(&local_3f8,&local_358,0x1e,&local_440);
                local_278 = &local_440;
                local_190 = local_278;
                if (local_440.refcount != (int *)0x0) {
                  local_194 = 0xffffffff;
                  LOCK();
                  local_198 = *local_440.refcount;
                  *local_440.refcount = *local_440.refcount + -1;
                  UNLOCK();
                  if (local_198 == 1) {
                    if (local_440.allocator == (Allocator *)0x0) {
                      local_68 = local_440.data;
                      if (local_440.data != (void *)0x0) {
                        free(local_440.data);
                      }
                    }
                    else {
                      (*(local_440.allocator)->_vptr_Allocator[3])
                                (local_440.allocator,local_440.data);
                    }
                  }
                }
                local_440.data = (void *)0x0;
                local_440.elemsize = 0;
                local_440.elempack = 0;
                local_440.dims = 0;
                local_440.w = 0;
                local_440.h = 0;
                local_440.d = 0;
                local_440.c = 0;
                local_440.cstep = 0;
                local_440.refcount = (int *)0x0;
                local_138 = &local_3f8;
                if ((int *)local_3f8.data != (int *)0x0) {
                  local_18 = local_138;
                }
                if ((int *)local_3f8.data != (int *)0x0 && local_3f8.cstep * (long)local_3f8.c != 0)
                {
                  local_130 = &local_3f8;
                  local_448 = (int *)local_3f8.data;
                  for (local_44c = 0; local_44c < local_368; local_44c = local_44c + 1) {
                    lVar6 = in_RDI[9];
                    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&local_380->tops,(long)local_44c);
                    pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                       ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                        (lVar6 + 8),(long)*pvVar7);
                    local_45c = *local_448;
                    local_458 = pvVar9;
                    if (local_45c == 1) {
                      local_104 = local_448[1];
                      local_100 = &local_4a8;
                      local_110 = 0;
                      local_118 = 4;
                      local_11c = 1;
                      local_128 = 0;
                      local_4a8 = (NetPrivate *)0x0;
                      local_4a0 = (int *)0x0;
                      local_498 = 4;
                      local_490 = 1;
                      local_488 = (long *)0x0;
                      local_480 = 1;
                      local_47c = local_104;
                      local_478 = 1;
                      local_474 = 1;
                      local_470 = 1;
                      local_468 = (long)local_104;
                      pMVar10 = &pvVar9->shape;
                      local_290 = &local_4a8;
                      local_288 = pMVar10;
                      if (pMVar10 != (Mat *)local_290) {
                        local_180 = pMVar10;
                        if ((pvVar9->shape).refcount != (int *)0x0) {
                          piVar1 = (pvVar9->shape).refcount;
                          local_184 = 0xffffffff;
                          LOCK();
                          local_188 = *piVar1;
                          *piVar1 = *piVar1 + -1;
                          UNLOCK();
                          if (local_188 == 1) {
                            if ((pvVar9->shape).allocator == (Allocator *)0x0) {
                              local_70 = pMVar10->data;
                              if (local_70 != (void *)0x0) {
                                free(local_70);
                              }
                            }
                            else {
                              pAVar2 = (pvVar9->shape).allocator;
                              (*pAVar2->_vptr_Allocator[3])(pAVar2,pMVar10->data);
                            }
                          }
                        }
                        pMVar10->data = (void *)0x0;
                        (pvVar9->shape).elemsize = 0;
                        (pvVar9->shape).elempack = 0;
                        (pvVar9->shape).dims = 0;
                        (pvVar9->shape).w = 0;
                        (pvVar9->shape).h = 0;
                        (pvVar9->shape).d = 0;
                        (pvVar9->shape).c = 0;
                        (pvVar9->shape).cstep = 0;
                        (pvVar9->shape).refcount = (int *)0x0;
                        pMVar10->data = *local_290;
                        (pvVar9->shape).refcount = (int *)local_290[1];
                        (pvVar9->shape).elemsize = (size_t)local_290[2];
                        (pvVar9->shape).elempack = *(int *)(local_290 + 3);
                        (pvVar9->shape).allocator = (Allocator *)local_290[4];
                        (pvVar9->shape).dims = *(int *)(local_290 + 5);
                        (pvVar9->shape).w = *(int *)((long)local_290 + 0x2c);
                        (pvVar9->shape).h = *(int *)(local_290 + 6);
                        (pvVar9->shape).d = *(int *)((long)local_290 + 0x34);
                        (pvVar9->shape).c = *(int *)(local_290 + 7);
                        (pvVar9->shape).cstep = (size_t)local_290[8];
                      }
                      local_268 = &local_4a8;
                      local_280 = pMVar10;
                      local_1b0 = local_268;
                      if (local_4a0 != (int *)0x0) {
                        local_1b4 = 0xffffffff;
                        LOCK();
                        local_1b8 = *local_4a0;
                        *local_4a0 = *local_4a0 + -1;
                        UNLOCK();
                        if (local_1b8 == 1) {
                          if (local_488 == (long *)0x0) {
                            local_58 = local_4a8;
                            if (local_4a8 != (NetPrivate *)0x0) {
                              free(local_4a8);
                            }
                          }
                          else {
                            (**(code **)(*local_488 + 0x18))(local_488,local_4a8);
                          }
                        }
                      }
                      local_4a8 = (NetPrivate *)0x0;
                      local_498 = 0;
                      local_490 = 0;
                      local_480 = 0;
                      local_47c = 0;
                      local_478 = 0;
                      local_474 = 0;
                      local_470 = 0;
                      local_468 = 0;
                      local_4a0 = (int *)0x0;
                    }
                    pvVar9 = local_458;
                    if (local_45c == 2) {
                      local_d4 = local_448[1];
                      local_d8 = local_448[2];
                      in_stack_fffffffffffff9e0 = (Net *)local_4f0;
                      local_e0 = 0;
                      local_e8 = 4;
                      local_ec = 1;
                      local_f8 = 0;
                      local_4f0 = (undefined1  [8])0x0;
                      local_4e8 = (int *)0x0;
                      local_4e0 = (Allocator *)0x4;
                      local_4d8 = 1;
                      local_4d0 = (long *)0x0;
                      local_4c8._0_1_ = true;
                      local_4c8._1_1_ = false;
                      local_4c8._2_1_ = false;
                      local_4c8._3_1_ = false;
                      local_4c4 = local_d4;
                      local_4c0 = local_d8;
                      local_4bc._0_1_ = true;
                      local_4bc._1_1_ = false;
                      local_4bc._2_1_ = false;
                      local_4bc._3_1_ = false;
                      local_4b8 = 1;
                      local_4b0 = (long)local_d4 * (long)local_d8;
                      pMVar10 = &local_458->shape;
                      local_2b0 = (undefined8 *)local_4f0;
                      local_2a8 = pMVar10;
                      local_d0 = in_stack_fffffffffffff9e0;
                      if (pMVar10 != (Mat *)local_2b0) {
                        local_170 = pMVar10;
                        if ((local_458->shape).refcount != (int *)0x0) {
                          piVar1 = (local_458->shape).refcount;
                          local_174 = 0xffffffff;
                          LOCK();
                          local_178 = *piVar1;
                          *piVar1 = *piVar1 + -1;
                          UNLOCK();
                          if (local_178 == 1) {
                            if ((local_458->shape).allocator == (Allocator *)0x0) {
                              local_78 = pMVar10->data;
                              if (local_78 != (void *)0x0) {
                                free(local_78);
                              }
                            }
                            else {
                              pAVar2 = (local_458->shape).allocator;
                              (*pAVar2->_vptr_Allocator[3])(pAVar2,pMVar10->data);
                            }
                          }
                        }
                        pMVar10->data = (void *)0x0;
                        (pvVar9->shape).elemsize = 0;
                        (pvVar9->shape).elempack = 0;
                        (pvVar9->shape).dims = 0;
                        (pvVar9->shape).w = 0;
                        (pvVar9->shape).h = 0;
                        (pvVar9->shape).d = 0;
                        (pvVar9->shape).c = 0;
                        (pvVar9->shape).cstep = 0;
                        (pvVar9->shape).refcount = (int *)0x0;
                        pMVar10->data = (void *)*local_2b0;
                        (pvVar9->shape).refcount = (int *)local_2b0[1];
                        (pvVar9->shape).elemsize = local_2b0[2];
                        (pvVar9->shape).elempack = *(int *)(local_2b0 + 3);
                        (pvVar9->shape).allocator = (Allocator *)local_2b0[4];
                        (pvVar9->shape).dims = *(int *)(local_2b0 + 5);
                        (pvVar9->shape).w = *(int *)((long)local_2b0 + 0x2c);
                        (pvVar9->shape).h = *(int *)(local_2b0 + 6);
                        (pvVar9->shape).d = *(int *)((long)local_2b0 + 0x34);
                        (pvVar9->shape).c = *(int *)(local_2b0 + 7);
                        (pvVar9->shape).cstep = local_2b0[8];
                      }
                      local_258 = local_4f0;
                      local_2a0 = pMVar10;
                      local_1d0 = local_258;
                      if (local_4e8 != (int *)0x0) {
                        local_1d4 = 0xffffffff;
                        LOCK();
                        local_1d8 = *local_4e8;
                        *local_4e8 = *local_4e8 + -1;
                        UNLOCK();
                        if (local_1d8 == 1) {
                          if (local_4d0 == (long *)0x0) {
                            local_48 = (_func_int **)local_4f0;
                            if (local_4f0 != (undefined1  [8])0x0) {
                              free((void *)local_4f0);
                            }
                          }
                          else {
                            (**(code **)(*local_4d0 + 0x18))(local_4d0,local_4f0);
                          }
                        }
                      }
                      local_4f0 = (undefined1  [8])0x0;
                      local_4e0 = (Allocator *)0x0;
                      local_4d8 = 0;
                      local_4c8._0_1_ = false;
                      local_4c8._1_1_ = false;
                      local_4c8._2_1_ = false;
                      local_4c8._3_1_ = false;
                      local_4c4._0_1_ = false;
                      local_4c4._1_1_ = false;
                      local_4c4._2_1_ = false;
                      local_4c4._3_1_ = false;
                      local_4c0._0_1_ = false;
                      local_4c0._1_1_ = false;
                      local_4c0._2_1_ = false;
                      local_4c0._3_1_ = false;
                      local_4bc._0_1_ = false;
                      local_4bc._1_1_ = false;
                      local_4bc._2_1_ = false;
                      local_4bc._3_1_ = false;
                      local_4b8 = 0;
                      local_4b0._0_1_ = false;
                      local_4b0._1_1_ = false;
                      local_4b0._2_1_ = false;
                      local_4b0._3_1_ = false;
                      local_4b0._4_1_ = false;
                      local_4b0._5_1_ = false;
                      local_4b0._6_1_ = false;
                      local_4b0._7_1_ = false;
                      local_4e8 = (int *)0x0;
                    }
                    pvVar9 = local_458;
                    if (local_45c == 3) {
                      local_9c = local_448[1];
                      local_a0 = local_448[2];
                      local_a4 = local_448[3];
                      local_98 = &local_538;
                      local_b0 = 0;
                      local_b8 = 4;
                      local_bc = 1;
                      local_c8 = 0;
                      local_538 = (void *)0x0;
                      local_530 = (int *)0x0;
                      local_528 = 4;
                      local_520 = 1;
                      local_518 = (long *)0x0;
                      local_510 = 3;
                      local_50c = local_9c;
                      local_508 = local_a0;
                      local_504 = 1;
                      local_500 = local_a4;
                      local_8 = (long)local_9c * (long)local_a0 * 4;
                      local_c = 0x10;
                      uVar11 = local_8 + 0xfU & 0xfffffffffffffff0;
                      local_4f8 = uVar11 / 4;
                      pMVar10 = &local_458->shape;
                      local_2d0 = &local_538;
                      local_2c8 = pMVar10;
                      if (pMVar10 != (Mat *)local_2d0) {
                        local_160 = pMVar10;
                        if ((local_458->shape).refcount != (int *)0x0) {
                          piVar1 = (local_458->shape).refcount;
                          local_164 = 0xffffffff;
                          LOCK();
                          local_168 = *piVar1;
                          *piVar1 = *piVar1 + -1;
                          UNLOCK();
                          if (local_168 == 1) {
                            if ((local_458->shape).allocator == (Allocator *)0x0) {
                              local_80 = pMVar10->data;
                              if (local_80 != (void *)0x0) {
                                free(local_80);
                              }
                            }
                            else {
                              pAVar2 = (local_458->shape).allocator;
                              (*pAVar2->_vptr_Allocator[3])(pAVar2,pMVar10->data,uVar11 % 4);
                            }
                          }
                        }
                        pMVar10->data = (void *)0x0;
                        (pvVar9->shape).elemsize = 0;
                        (pvVar9->shape).elempack = 0;
                        (pvVar9->shape).dims = 0;
                        (pvVar9->shape).w = 0;
                        (pvVar9->shape).h = 0;
                        (pvVar9->shape).d = 0;
                        (pvVar9->shape).c = 0;
                        (pvVar9->shape).cstep = 0;
                        (pvVar9->shape).refcount = (int *)0x0;
                        pMVar10->data = *local_2d0;
                        (pvVar9->shape).refcount = (int *)local_2d0[1];
                        (pvVar9->shape).elemsize = (size_t)local_2d0[2];
                        (pvVar9->shape).elempack = *(int *)(local_2d0 + 3);
                        (pvVar9->shape).allocator = (Allocator *)local_2d0[4];
                        (pvVar9->shape).dims = *(int *)(local_2d0 + 5);
                        (pvVar9->shape).w = *(int *)((long)local_2d0 + 0x2c);
                        (pvVar9->shape).h = *(int *)(local_2d0 + 6);
                        (pvVar9->shape).d = *(int *)((long)local_2d0 + 0x34);
                        (pvVar9->shape).c = *(int *)(local_2d0 + 7);
                        (pvVar9->shape).cstep = (size_t)local_2d0[8];
                      }
                      local_248 = &local_538;
                      local_2c0 = pMVar10;
                      local_1f0 = local_248;
                      if (local_530 != (int *)0x0) {
                        local_1f4 = 0xffffffff;
                        LOCK();
                        local_1f8 = *local_530;
                        *local_530 = *local_530 + -1;
                        UNLOCK();
                        if (local_1f8 == 1) {
                          if (local_518 == (long *)0x0) {
                            local_38 = local_538;
                            if (local_538 != (void *)0x0) {
                              free(local_538);
                            }
                          }
                          else {
                            (**(code **)(*local_518 + 0x18))(local_518,local_538);
                          }
                        }
                      }
                      local_538 = (void *)0x0;
                      local_528 = 0;
                      local_520 = 0;
                      local_510 = 0;
                      local_50c = 0;
                      local_508 = 0;
                      local_504 = 0;
                      local_500 = 0;
                      local_4f8 = 0;
                      local_530 = (int *)0x0;
                    }
                    local_448 = local_448 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                           CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                for (local_53c = 0; local_53c < local_364; local_53c = local_53c + 1) {
                  lVar6 = in_RDI[9];
                  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_380->bottoms,(long)local_53c);
                  pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(lVar6 + 8)
                                      ,(long)*pvVar7);
                  pMVar10 = &pvVar9->shape;
                  pvVar12 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                      (&local_380->bottom_shapes,(long)local_53c);
                  local_2f0 = pMVar10;
                  local_2e8 = pvVar12;
                  if (pvVar12 != pMVar10) {
                    if ((pvVar9->shape).refcount != (int *)0x0) {
                      piVar1 = (pvVar9->shape).refcount;
                      local_2f4 = 1;
                      LOCK();
                      local_2f8 = *piVar1;
                      *piVar1 = *piVar1 + 1;
                      UNLOCK();
                    }
                    local_150 = pvVar12;
                    if (pvVar12->refcount != (int *)0x0) {
                      piVar1 = pvVar12->refcount;
                      local_154 = 0xffffffff;
                      LOCK();
                      local_158 = *piVar1;
                      *piVar1 = *piVar1 + -1;
                      UNLOCK();
                      if (local_158 == 1) {
                        if (pvVar12->allocator == (Allocator *)0x0) {
                          local_88 = pvVar12->data;
                          if (local_88 != (void *)0x0) {
                            free(local_88);
                          }
                        }
                        else {
                          (*pvVar12->allocator->_vptr_Allocator[3])
                                    (pvVar12->allocator,pvVar12->data);
                        }
                      }
                    }
                    pvVar12->data = (void *)0x0;
                    pvVar12->elemsize = 0;
                    pvVar12->elempack = 0;
                    pvVar12->dims = 0;
                    pvVar12->w = 0;
                    pvVar12->h = 0;
                    pvVar12->d = 0;
                    pvVar12->c = 0;
                    pvVar12->cstep = 0;
                    pvVar12->refcount = (int *)0x0;
                    pvVar12->data = local_2f0->data;
                    pvVar12->refcount = local_2f0->refcount;
                    pvVar12->elemsize = local_2f0->elemsize;
                    pvVar12->elempack = local_2f0->elempack;
                    pvVar12->allocator = local_2f0->allocator;
                    pvVar12->dims = local_2f0->dims;
                    pvVar12->w = local_2f0->w;
                    pvVar12->h = local_2f0->h;
                    pvVar12->d = local_2f0->d;
                    pvVar12->c = local_2f0->c;
                    pvVar12->cstep = local_2f0->cstep;
                  }
                  local_2e0 = pvVar12;
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                           CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
                for (local_540 = 0; local_540 < local_368; local_540 = local_540 + 1) {
                  in_stack_fffffffffffff960 = (NetPrivate *)(in_RDI[9] + 8);
                  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_380->tops,(long)local_540);
                  pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_fffffffffffff960,(long)*pvVar7);
                  pMVar10 = &pvVar9->shape;
                  pvVar12 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                      (&local_380->top_shapes,(long)local_540);
                  local_310 = pMVar10;
                  local_308 = pvVar12;
                  if (pvVar12 != pMVar10) {
                    if ((pvVar9->shape).refcount != (int *)0x0) {
                      piVar1 = (pvVar9->shape).refcount;
                      local_314 = 1;
                      LOCK();
                      local_318 = *piVar1;
                      *piVar1 = *piVar1 + 1;
                      UNLOCK();
                    }
                    local_140 = pvVar12;
                    if (pvVar12->refcount != (int *)0x0) {
                      piVar1 = pvVar12->refcount;
                      local_144 = 0xffffffff;
                      LOCK();
                      local_148 = *piVar1;
                      *piVar1 = *piVar1 + -1;
                      UNLOCK();
                      if (local_148 == 1) {
                        if (pvVar12->allocator == (Allocator *)0x0) {
                          local_90 = pvVar12->data;
                          if (local_90 != (void *)0x0) {
                            free(local_90);
                          }
                        }
                        else {
                          (*pvVar12->allocator->_vptr_Allocator[3])
                                    (pvVar12->allocator,pvVar12->data);
                        }
                      }
                    }
                    pvVar12->data = (void *)0x0;
                    pvVar12->elemsize = 0;
                    pvVar12->elempack = 0;
                    pvVar12->dims = 0;
                    pvVar12->w = 0;
                    pvVar12->h = 0;
                    pvVar12->d = 0;
                    pvVar12->c = 0;
                    pvVar12->cstep = 0;
                    pvVar12->refcount = (int *)0x0;
                    pvVar12->data = local_310->data;
                    pvVar12->refcount = local_310->refcount;
                    pvVar12->elemsize = local_310->elemsize;
                    pvVar12->elempack = local_310->elempack;
                    pvVar12->allocator = local_310->allocator;
                    pvVar12->dims = local_310->dims;
                    pvVar12->w = local_310->w;
                    pvVar12->h = local_310->h;
                    pvVar12->d = local_310->d;
                    pvVar12->c = local_310->c;
                    pvVar12->cstep = local_310->cstep;
                  }
                  local_300 = pvVar12;
                }
                in_stack_fffffffffffff954 = ParamDict::get(&local_358,0x1f,0);
                local_380->featmask = in_stack_fffffffffffff954;
                in_stack_fffffffffffff950 = (*local_380->_vptr_Layer[2])(local_380,&local_358);
                pFVar3 = _stderr;
                if (in_stack_fffffffffffff950 == 0) {
                  in_stack_fffffffffffff938 = local_380;
                  ppLVar13 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                       ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                        (in_RDI[9] + 0x20),(long)(int)local_35c);
                  *ppLVar13 = in_stack_fffffffffffff938;
                  local_378 = 0;
                }
                else {
                  in_stack_fffffffffffff94c = local_35c;
                  uVar8 = std::__cxx11::string::c_str();
                  fprintf(pFVar3,"layer load_param %d %s failed",(ulong)in_stack_fffffffffffff94c,
                          uVar8);
                  fprintf(_stderr,"\n");
                  local_378 = 0xe;
                }
                in_stack_fffffffffffff930 = &local_3f8;
                local_238 = in_stack_fffffffffffff930;
                local_210 = in_stack_fffffffffffff930;
                if (local_3f8.refcount != (int *)0x0) {
                  local_214 = 0xffffffff;
                  LOCK();
                  local_218 = *local_3f8.refcount;
                  *local_3f8.refcount = *local_3f8.refcount + -1;
                  UNLOCK();
                  if (local_218 == 1) {
                    if (local_3f8.allocator == (Allocator *)0x0) {
                      if ((int *)local_3f8.data != (int *)0x0) {
                        free(local_3f8.data);
                      }
                    }
                    else {
                      (*(local_3f8.allocator)->_vptr_Allocator[3])
                                (local_3f8.allocator,local_3f8.data);
                    }
                  }
                }
                in_stack_fffffffffffff930->data = (void *)0x0;
                in_stack_fffffffffffff930->elemsize = 0;
                in_stack_fffffffffffff930->elempack = 0;
                in_stack_fffffffffffff930->dims = 0;
                in_stack_fffffffffffff930->w = 0;
                in_stack_fffffffffffff930->h = 0;
                in_stack_fffffffffffff930->d = 0;
                in_stack_fffffffffffff930->c = 0;
                in_stack_fffffffffffff930->cstep = 0;
                in_stack_fffffffffffff930->refcount = (int *)0x0;
              }
              else {
                uVar8 = std::__cxx11::string::c_str();
                fprintf(pFVar3,"ParamDict load_param %d %s failed",(ulong)uVar5,uVar8);
                fprintf(_stderr,"\n");
              }
            }
            NetPrivate::update_input_output_indexes(in_stack_fffffffffffff960);
            local_324 = 0;
LAB_0019cf54:
            local_378 = 1;
            ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff930);
          }
        }
        else {
          fprintf(_stderr,"read blob_count failed");
          fprintf(_stderr,"\n");
          local_324 = -1;
        }
      }
      else {
        fprintf(_stderr,"read layer_count failed");
        fprintf(_stderr,"\n");
        local_324 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate");
      fprintf(_stderr,"\n");
      local_324 = -1;
    }
  }
  else {
    fprintf(_stderr,"read magic failed");
    fprintf(_stderr,"\n");
    local_324 = -1;
  }
  return local_324;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_overwrite_builtin_layer(typeindex);
        if (!layer)
        {
            layer = create_layer(typeindex);
        }
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("ParamDict load_param %d failed", i);
#endif
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_param %d failed", i);
#endif
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}